

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O2

int cmd_list(char *arg)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  undefined8 *__ptr;
  char *pcVar3;
  undefined8 *puVar4;
  int *piVar5;
  undefined4 uVar6;
  char *__format;
  size_t __size;
  undefined4 local_3c;
  LYD_FORMAT LStack_38;
  int option_index;
  
  __ptr = (undefined8 *)malloc(0x10);
  pcVar3 = strdup(arg);
  *__ptr = pcVar3;
  strtok(pcVar3," ");
  iVar2 = -1;
  __size = 0x18;
  do {
    pcVar3 = strtok((char *)0x0," ");
    if (pcVar3 == (char *)0x0) {
      __ptr[(uint)-iVar2] = 0;
      _optind = 0;
      uVar6 = 0;
      do {
        do {
          _LStack_38 = (char *)CONCAT44(option_index,uVar6);
          while( true ) {
            local_3c = 0;
            iVar1 = getopt_long(-iVar2,__ptr,"hf:",cmd_list::long_options,&local_3c);
            if (iVar1 == -1) {
              if (iVar2 + _optind == 0) {
                free((void *)*__ptr);
                free(__ptr);
                iVar2 = print_list(_stdout,ctx,LStack_38);
                return iVar2;
              }
              pcVar3 = (char *)__ptr[_optind];
              __format = "Unknown parameter \"%s\"\n";
              goto LAB_00108c01;
            }
            if (iVar1 == 0x3f) goto LAB_00108c08;
            if (iVar1 == 0x66) break;
            if (iVar1 == 0x68) {
              cmd_data_help();
              free((void *)*__ptr);
              free(__ptr);
              return 0;
            }
          }
          _LStack_38 = _optarg;
          iVar1 = strcmp(_optarg,"xml");
          uVar6 = 1;
        } while (iVar1 == 0);
        iVar1 = strcmp(_LStack_38,"json");
        uVar6 = 2;
      } while (iVar1 == 0);
      __format = "Unknown output format \"%s\".\n";
      pcVar3 = _LStack_38;
LAB_00108c01:
      fprintf(_stderr,__format,pcVar3);
LAB_00108c08:
      free((void *)*__ptr);
      free(__ptr);
      return 1;
    }
    puVar4 = (undefined8 *)realloc(__ptr,__size);
    __stream = _stderr;
    if (puVar4 == (undefined8 *)0x0) {
      piVar5 = __errno_location();
      pcVar3 = strerror(*piVar5);
      fprintf(__stream,"Memory allocation failed (%s:%d, %s)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/tools/lint/commands.c"
              ,0x45b,pcVar3);
      goto LAB_00108c08;
    }
    *(char **)((long)puVar4 + (__size - 0x10)) = pcVar3;
    iVar2 = iVar2 + -1;
    __size = __size + 8;
    __ptr = puVar4;
  } while( true );
}

Assistant:

int
cmd_list(const char *arg)
{
    char **argv = NULL, *ptr;
    int c, argc, option_index;
    LYD_FORMAT outformat = LYD_UNKNOWN;
    static struct option long_options[] = {
        {"help", no_argument, 0, 'h'},
        {"format", required_argument, 0, 'f'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc+2)*sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto error;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "hf:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'h':
            cmd_data_help();
            free(*argv);
            free(argv);
            return 0;
        case 'f':
            if (!strcmp(optarg, "xml")) {
                outformat = LYD_XML;
            } else if (!strcmp(optarg, "json")) {
                outformat = LYD_JSON;
            } else {
                fprintf(stderr, "Unknown output format \"%s\".\n", optarg);
                goto error;
            }
            break;
        case '?':
            /* getopt_long() prints message */
            goto error;
        }
    }
    if (optind != argc) {
        fprintf(stderr, "Unknown parameter \"%s\"\n", argv[optind]);
error:
        free(*argv);
        free(argv);
        return 1;
    }
    free(*argv);
    free(argv);

    return print_list(stdout, ctx, outformat);
}